

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

Vec_Str_t * Vec_StrStart(int nSize)

{
  Vec_Str_t *pVVar1;
  Vec_Str_t *p;
  int nSize_local;
  
  pVVar1 = Vec_StrAlloc(nSize);
  pVVar1->nSize = nSize;
  memset(pVVar1->pArray,0,(long)nSize);
  return pVVar1;
}

Assistant:

static inline Vec_Str_t * Vec_StrStart( int nSize )
{
    Vec_Str_t * p;
    p = Vec_StrAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(char) * nSize );
    return p;
}